

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansi.cc
# Opt level: O0

size_t ixxx::ansi::fwrite(void *__ptr,size_t __size,size_t __n,FILE *__s)

{
  size_t sVar1;
  fwrite_error *this;
  int *piVar2;
  size_t r;
  FILE *stream_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  sVar1 = ::fwrite(__ptr,__size,__n,__s);
  if (sVar1 != __size * __n) {
    this = (fwrite_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    fwrite_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
    __cxa_throw(this,&fwrite_error::typeinfo,fwrite_error::~fwrite_error);
  }
  return sVar1;
}

Assistant:

size_t fwrite(const void *ptr, size_t size, size_t nmemb, FILE *stream)
    {
      size_t r = ::fwrite(ptr, size, nmemb, stream);
      if (r != size*nmemb)
        throw fwrite_error(errno);
      return r;
    }